

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_conn.c
# Opt level: O0

int proxy_conn_in_use(proxy_conn_handle *pc)

{
  long *plVar1;
  uint local_1c;
  int ret;
  proxy_conn_priv *priv;
  proxy_conn_handle *pc_local;
  
  plVar1 = (long *)pc->priv;
  mutex_lock_shared((mutex_handle *)(plVar1 + 0xd));
  local_1c = (uint)(*plVar1 != 0);
  mutex_unlock_shared((mutex_handle *)(plVar1 + 0xd));
  return local_1c;
}

Assistant:

int proxy_conn_in_use(struct proxy_conn_handle *pc)
{
	struct proxy_conn_priv *priv = pc->priv;
	int ret = 0;

	mutex_lock_shared(&priv->mutex_client);

	if (priv->conn_client != NULL)
		ret = 1;

	mutex_unlock_shared(&priv->mutex_client);

	return ret;
}